

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

vector<absl::string_view,_std::allocator<absl::string_view>_> *
absl::StrSplit<absl::string_view>
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          string_view *text,char delim,function<bool_(absl::string_view)> *predicate)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  size_type pos;
  string_view __args;
  string_view __args_00;
  string_view view;
  string_view local_40;
  
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pos = 0;
  while( true ) {
    sVar3 = string_view::find(text,delim,pos);
    if (sVar3 == 0xffffffffffffffff) break;
    local_40.ptr_ = text->ptr_ + pos;
    local_40.length_ = string_view::CheckLengthInternal(sVar3 - pos);
    __args.length_ = local_40.length_;
    __args.ptr_ = local_40.ptr_;
    bVar2 = std::function<bool_(absl::string_view)>::operator()(predicate,__args);
    if (bVar2) {
      std::vector<absl::string_view,std::allocator<absl::string_view>>::
      emplace_back<absl::string_view&>
                ((vector<absl::string_view,std::allocator<absl::string_view>> *)
                 __return_storage_ptr__,&local_40);
    }
    pos = sVar3 + 1;
  }
  pcVar1 = text->ptr_;
  local_40.ptr_ = pcVar1 + pos;
  local_40.length_ = string_view::CheckLengthInternal(text->length_ - pos);
  __args_00.length_ = local_40.length_;
  __args_00.ptr_ = pcVar1 + pos;
  bVar2 = std::function<bool_(absl::string_view)>::operator()(predicate,__args_00);
  if (bVar2) {
    std::vector<absl::string_view,std::allocator<absl::string_view>>::
    emplace_back<absl::string_view&>
              ((vector<absl::string_view,std::allocator<absl::string_view>> *)__return_storage_ptr__
               ,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}